

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O2

uint32_t icu_63::util64_tou(int64_t w,UChar *buf,uint32_t len,uint32_t radix,UBool raw)

{
  UChar UVar1;
  UChar *pUVar2;
  UChar *pUVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  UChar *pUVar7;
  long lVar8;
  long lVar9;
  
  uVar6 = 2;
  if (2 < radix) {
    uVar6 = radix;
  }
  uVar5 = 0x24;
  if (uVar6 < 0x24) {
    uVar5 = (ulong)uVar6;
  }
  if ((((raw == '\0') && (len != 0)) && (w < 0)) && (radix == 10)) {
    w = -w;
    lVar8 = 0x2d;
  }
  else {
    pUVar3 = buf;
    if (w != 0 || len == 0) goto LAB_0024fbb9;
    w = 0;
    lVar8 = 0x30;
    if (raw != '\0') {
      lVar8 = w;
    }
  }
  *buf = (UChar)lVar8;
  len = len - 1;
  pUVar3 = buf + 1;
LAB_0024fbb9:
  lVar9 = 0;
  lVar8 = 0;
  while ((len != (uint32_t)lVar9 && (w != 0))) {
    uVar4 = w % (long)uVar5;
    if (raw == '\0') {
      uVar4 = (ulong)(byte)"0123456789abcdefghijklmnopqrstuvwxyz"[(int)uVar4];
    }
    pUVar3[lVar9] = (UChar)uVar4;
    lVar8 = lVar8 + -2;
    lVar9 = lVar9 + 1;
    w = w / (long)uVar5;
  }
  if (len != (uint32_t)lVar9) {
    pUVar3[lVar9] = L'\0';
  }
  pUVar7 = (UChar *)((long)pUVar3 + (-2 - lVar8));
  for (pUVar2 = buf + (*buf == L'-'); pUVar2 < pUVar7; pUVar2 = pUVar2 + 1) {
    UVar1 = *pUVar7;
    *pUVar7 = *pUVar2;
    *pUVar2 = UVar1;
    pUVar7 = pUVar7 + -1;
  }
  return (uint32_t)((ulong)((long)pUVar3 + (-lVar8 - (long)buf)) >> 1);
}

Assistant:

uint32_t util64_tou(int64_t w, UChar* buf, uint32_t len, uint32_t radix, UBool raw)
{    
    if (radix > 36) {
        radix = 36;
    } else if (radix < 2) {
        radix = 2;
    }
    int64_t base = radix;

    UChar* p = buf;
    if (len && (w < 0) && (radix == 10) && !raw) {
        w = -w;
        *p++ = kUMinus;
        --len;
    } else if (len && (w == 0)) {
        *p++ = (UChar)raw ? 0 : asciiDigits[0];
        --len;
    }

    while (len && (w != 0)) {
        int64_t n = w / base;
        int64_t m = n * base;
        int32_t d = (int32_t)(w-m);
        *p++ = (UChar)(raw ? d : asciiDigits[d]);
        w = n;
        --len;
    }
    if (len) {
        *p = 0; // null terminate if room for caller convenience
    }

    len = (uint32_t)(p - buf);
    if (*buf == kUMinus) {
        ++buf;
    }
    while (--p > buf) {
        UChar c = *p;
        *p = *buf;
        *buf = c;
        ++buf;
    }

    return len;
}